

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

ostream * ccs::operator<<(ostream *out,Key *key)

{
  bool bVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  
  p_Var4 = (key->values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = true;
  while ((_Rb_tree_header *)p_Var4 != &(key->values_)._M_t._M_impl.super__Rb_tree_header) {
    if (!bVar1) {
      std::operator<<(out,'/');
    }
    std::operator<<(out,(string *)(p_Var4 + 1));
    for (p_Var3 = p_Var4[2]._M_right; p_Var3 != (_Rb_tree_node_base *)&p_Var4[2]._M_parent;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      poVar2 = std::operator<<(out,'.');
      std::operator<<(poVar2,(string *)(p_Var3 + 1));
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    bVar1 = false;
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Key &key) {
  bool first = true;
  for (auto it = key.values_.cbegin(); it != key.values_.cend(); ++it) {
    if (!first) out << '/';
    out << it->first;
    for (auto it2 = it->second.cbegin(); it2 != it->second.cend(); ++it2) {
      // MMH the java version checks to see if *it2 is actually an ident, and
      // if not, quotes/escapes it. a nice touch, but maybe more trouble than
      // it's worth.
      //if (identRegex.matcher(*it2).matches())
      out << '.' << *it2;
      //else
      //  out << ".'" << v.replace("'", "\\'") << '\'';
    }
    first = false;
  }
  return out;
}